

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d95011::TargetSourcesImpl::HandleDirectContent
          (TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  undefined1 local_c0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_22;
  undefined1 local_21;
  bool param_4_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetSourcesImpl *this_local;
  
  local_22 = param_4;
  local_21 = param_3;
  pvStack_20 = content;
  content_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)tgt;
  tgt_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SOURCES",&local_49);
  ConvertToAbsoluteContent(&local_98,this,(cmTarget *)content_local,pvStack_20,No,Yes);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
            (&local_80,this,&local_98);
  cmMakefile::GetBacktrace((cmMakefile *)local_c0);
  std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
            ((optional<cmListFileBacktrace> *)(local_c0 + 0x10),(cmListFileBacktrace *)local_c0);
  cmTarget::AppendProperty
            (tgt,&local_48,&local_80,(optional<cmListFileBacktrace> *)(local_c0 + 0x10),false);
  std::optional<cmListFileBacktrace>::~optional((optional<cmListFileBacktrace> *)(local_c0 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    tgt->AppendProperty("SOURCES",
                        this->Join(this->ConvertToAbsoluteContent(
                          tgt, content, IsInterface::No, CheckCMP0076::Yes)),
                        this->Makefile->GetBacktrace());
    return true; // Successfully handled.
  }